

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O2

void __thiscall
DISTRHO::PluginExporter::run(PluginExporter *this,float **inputs,float **outputs,uint32_t frames)

{
  PrivateData *pPVar1;
  int line;
  Plugin *pPVar2;
  char *assertion;
  
  pPVar1 = this->fData;
  if (pPVar1 == (PrivateData *)0x0) {
    assertion = "fData != nullptr";
    line = 0x354;
  }
  else {
    pPVar2 = this->fPlugin;
    if (pPVar2 != (Plugin *)0x0) {
      if (this->fIsActive == false) {
        this->fIsActive = true;
        (*pPVar2->_vptr_Plugin[0xf])();
        pPVar2 = this->fPlugin;
        pPVar1 = this->fData;
      }
      pPVar1->isProcessing = true;
      (*pPVar2->_vptr_Plugin[0x11])(pPVar2,inputs,outputs,(ulong)frames);
      this->fData->isProcessing = false;
      return;
    }
    assertion = "fPlugin != nullptr";
    line = 0x355;
  }
  d_safe_assert(assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
                ,line);
  return;
}

Assistant:

void run(const float** const inputs, float** const outputs, const uint32_t frames)
    {
        DISTRHO_SAFE_ASSERT_RETURN(fData != nullptr,);
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr,);

        if (! fIsActive)
        {
            fIsActive = true;
            fPlugin->activate();
        }

        fData->isProcessing = true;
        fPlugin->run(inputs, outputs, frames);
        fData->isProcessing = false;
    }